

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

int __thiscall QCss::ValueExtractor::extractStyleFeatures(ValueExtractor *this)

{
  Declaration *pDVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->declarations).d.size != 0) {
    lVar3 = 0;
    uVar4 = 0;
    iVar2 = 0;
    do {
      pDVar1 = (this->declarations).d.ptr;
      if (*(int *)(*(long *)((long)&(pDVar1->d).d.ptr + lVar3) + 0x20) == 0x53) {
        iVar2 = Declaration::styleFeaturesValue((Declaration *)((long)&(pDVar1->d).d.ptr + lVar3));
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 8;
    } while (uVar4 < (ulong)(this->declarations).d.size);
    return iVar2;
  }
  return 0;
}

Assistant:

int ValueExtractor::extractStyleFeatures()
{
    int features = StyleFeature_None;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->propertyId == QtStyleFeatures)
            features = decl.styleFeaturesValue();
    }
    return features;
}